

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int mriStep_SetNonlinCRDown(ARKodeMem ark_mem,sunrealtype crdown)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_20;
  double local_18;
  
  local_18 = crdown;
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetNonlinCRDown",&local_20);
  if (iVar1 == 0) {
    local_20->crdown =
         (sunrealtype)
         (~-(ulong)(0.0 < local_18) & 0x3fd3333333333333 |
         (ulong)local_18 & -(ulong)(0.0 < local_18));
  }
  return iVar1;
}

Assistant:

int mriStep_SetNonlinCRDown(ARKodeMem ark_mem, sunrealtype crdown)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if argument legal set it, otherwise set default */
  if (crdown <= ZERO) { step_mem->crdown = CRDOWN; }
  else { step_mem->crdown = crdown; }

  return (ARK_SUCCESS);
}